

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,BranchInst *br,bool param_2)

{
  Value *pVVar1;
  BasicBlock *bb;
  BasicBlock *local_38;
  BasicBlock *local_30;
  Value *local_28;
  
  std::operator<<((ostream *)this,"br ");
  pVVar1 = BranchInst::getCondition(br);
  if (pVVar1 != (Value *)0x0) {
    local_28 = BranchInst::getCondition(br);
    local_30 = BranchInst::getSuccessor(br,0);
    local_38 = BranchInst::getSuccessor(br,1);
    append<LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*,char_const(&)[3],LLVMBC::BasicBlock*>
              (this,&local_28,(char (*) [3])", ",&local_30,(char (*) [3])", ",&local_38);
    return;
  }
  bb = BranchInst::getSuccessor(br,0);
  append(this,bb,false);
  return;
}

Assistant:

void StreamState::append(BranchInst *br, bool)
{
	append("br ");
	if (br->getCondition())
		append(br->getCondition(), ", ", br->getSuccessor(0), ", ", br->getSuccessor(1));
	else
		append(br->getSuccessor(0));
}